

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

char * get_reg_var_name(c2m_ctx_t c2m_ctx,MIR_type_t promoted_type,char *suffix,uint func_scope_num)

{
  char *pcVar1;
  str_t sVar2;
  char prefix [50];
  char acStack_58 [64];
  
  if (promoted_type - MIR_T_I32 < 5) {
    pcVar1 = &DAT_00189710 + *(int *)(&DAT_00189710 + (ulong)(promoted_type - MIR_T_I32) * 4);
  }
  else {
    pcVar1 = "D%u_";
    if (promoted_type == MIR_T_D) {
      pcVar1 = "d%u_";
    }
  }
  sprintf(acStack_58,pcVar1,(ulong)func_scope_num);
  VARR_chartrunc(c2m_ctx->temp_string,0);
  add_to_temp_string(c2m_ctx,acStack_58);
  add_to_temp_string(c2m_ctx,suffix);
  pcVar1 = VARR_charaddr(c2m_ctx->temp_string);
  sVar2 = uniq_cstr(c2m_ctx,pcVar1);
  return sVar2.s;
}

Assistant:

static const char *get_reg_var_name (c2m_ctx_t c2m_ctx, MIR_type_t promoted_type,
                                     const char *suffix, unsigned func_scope_num) {
  char prefix[50];

  sprintf (prefix,
           promoted_type == MIR_T_I64   ? "I%u_"
           : promoted_type == MIR_T_U64 ? "U%u_"
           : promoted_type == MIR_T_I32 ? "i%u_"
           : promoted_type == MIR_T_U32 ? "u%u_"
           : promoted_type == MIR_T_F   ? "f%u_"
           : promoted_type == MIR_T_D   ? "d%u_"
                                        : "D%u_",
           func_scope_num);
  VARR_TRUNC (char, temp_string, 0);
  add_to_temp_string (c2m_ctx, prefix);
  add_to_temp_string (c2m_ctx, suffix);
  return uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
}